

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O3

int mbedtls_ecjpake_derive_secret
              (mbedtls_ecjpake_context *ctx,uchar *buf,size_t len,size_t *olen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  byte bVar1;
  int iVar2;
  mbedtls_md_info_t *pmVar3;
  ulong buflen;
  undefined1 local_88 [8];
  mbedtls_ecp_point K;
  uchar kx [32];
  
  pmVar3 = mbedtls_md_info_from_type(ctx->md_type);
  bVar1 = mbedtls_md_get_size(pmVar3);
  *olen = (ulong)bVar1;
  iVar2 = -0x4f00;
  if (bVar1 <= len) {
    mbedtls_ecp_point_init((mbedtls_ecp_point *)local_88);
    iVar2 = mbedtls_ecjpake_derive_k(ctx,(mbedtls_ecp_point *)local_88,f_rng,p_rng);
    if (iVar2 == 0) {
      buflen = (ctx->grp).pbits + 7 >> 3;
      iVar2 = mbedtls_mpi_write_binary((mbedtls_mpi *)local_88,(uchar *)&K.Z.s,buflen);
      if (iVar2 == 0) {
        pmVar3 = mbedtls_md_info_from_type(ctx->md_type);
        iVar2 = mbedtls_md(pmVar3,(uchar *)&K.Z.s,buflen,buf);
      }
    }
    mbedtls_ecp_point_free((mbedtls_ecp_point *)local_88);
  }
  return iVar2;
}

Assistant:

int mbedtls_ecjpake_derive_secret(mbedtls_ecjpake_context *ctx,
                                  unsigned char *buf, size_t len, size_t *olen,
                                  int (*f_rng)(void *, unsigned char *, size_t),
                                  void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_ecp_point K;
    unsigned char kx[MBEDTLS_ECP_MAX_BYTES];
    size_t x_bytes;

    *olen = mbedtls_md_get_size_from_type(ctx->md_type);
    if (len < *olen) {
        return MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
    }

    mbedtls_ecp_point_init(&K);

    ret = mbedtls_ecjpake_derive_k(ctx, &K, f_rng, p_rng);
    if (ret) {
        goto cleanup;
    }

    /* PMS = SHA-256( K.X ) */
    x_bytes = (ctx->grp.pbits + 7) / 8;
    MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(&K.X, kx, x_bytes));
    MBEDTLS_MPI_CHK(mbedtls_ecjpake_compute_hash(ctx->md_type,
                                                 kx, x_bytes, buf));

cleanup:
    mbedtls_ecp_point_free(&K);

    return ret;
}